

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::DescriptorBuilder::AllocateNameString
          (DescriptorBuilder *this,string *scope,string *proto_name)

{
  ulong uVar1;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  AlphaNum *in_RDI;
  string *full_name;
  AlphaNum *in_stack_ffffffffffffff30;
  Tables *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  Tables *in_stack_ffffffffffffff50;
  string local_40 [32];
  string *local_20;
  AlphaNum *a;
  
  a = in_RDI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_20 = DescriptorPool::Tables::AllocateEmptyString_abi_cxx11_(in_stack_ffffffffffffff40);
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffff30,(string *)in_RDI);
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffff30,(char *)in_RDI);
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffff30,(string *)in_RDI);
    StrCat_abi_cxx11_(a,in_RSI,in_RDX);
    std::__cxx11::string::operator=((string *)local_20,local_40);
    std::__cxx11::string::~string(local_40);
  }
  else {
    local_20 = DescriptorPool::Tables::AllocateString
                         (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  return local_20;
}

Assistant:

std::string* DescriptorBuilder::AllocateNameString(
    const std::string& scope, const std::string& proto_name) {
  std::string* full_name;
  if (scope.empty()) {
    full_name = tables_->AllocateString(proto_name);
  } else {
    full_name = tables_->AllocateEmptyString();
    *full_name = StrCat(scope, ".", proto_name);
  }
  return full_name;
}